

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall CLOptions::PrintBools(CLOptions *this,bool detailed)

{
  bool bVar1;
  pointer ppVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  *this_00;
  iterator iter;
  _Self local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  local_28;
  
  this_00 = &this->params_bools;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          ::empty(this_00);
  if (!bVar1) {
    if (detailed) {
      puts("*****************");
      puts("  BOOLEANS");
      puts("*****************");
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::_Rb_tree_iterator(&local_28);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
         ::begin(this_00);
    while( true ) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
           ::end(this_00);
      bVar1 = std::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
               ::operator->(&local_28);
      if (detailed) {
        CLParam<bool>::Print((CLParam<bool> *)ppVar2->second);
      }
      else {
        CLParam<bool>::PrintSimple((CLParam<bool> *)ppVar2->second);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
      ::operator++(&local_28);
    }
  }
  return;
}

Assistant:

void CLOptions::PrintBools(bool detailed)
{
    // Dont do anything if the map is emtpy
    if (params_bools.empty()) return ;
    
    // Print a parameter header if doing detailed
    if (detailed) {
        std::printf("*****************\n") ;
        std::printf("  BOOLEANS\n") ;
        std::printf("*****************\n") ;
    }
    
    // Now loop through each of the parameters
    std::map<std::string, CLBool*>::iterator iter ;
    for (iter=params_bools.begin(); iter!=params_bools.end(); ++iter) {
        if (detailed) {iter->second->Print() ;}
        else          {iter->second->PrintSimple() ;}
    }
}